

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::GetReflectionClassName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  FileDescriptor *extraout_RDX;
  FileDescriptor *extraout_RDX_00;
  FileDescriptor *descriptor_00;
  string result;
  string local_38;
  
  GetFileNamespace_abi_cxx11_(&result,this,descriptor);
  descriptor_00 = extraout_RDX;
  if (result._M_string_length != 0) {
    std::__cxx11::string::push_back((char)&result);
    descriptor_00 = extraout_RDX_00;
  }
  GetReflectionClassUnqualifiedName_abi_cxx11_(&local_38,this,descriptor_00);
  std::__cxx11::string::append((string *)&result);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(__return_storage_ptr__,"global::",&result);
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

std::string GetReflectionClassName(const FileDescriptor* descriptor) {
  std::string result = GetFileNamespace(descriptor);
  if (!result.empty()) {
    result += '.';
  }
  result += GetReflectionClassUnqualifiedName(descriptor);
  return "global::" + result;
}